

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O2

void __thiscall cmStateSnapshot::SetDirectoryDefinitions(cmStateSnapshot *this)

{
  string *psVar1;
  allocator<char> local_29;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"CMAKE_SOURCE_DIR",&local_29);
  psVar1 = cmState::GetSourceDirectory_abi_cxx11_(this->State);
  SetDefinition(this,&local_28,psVar1);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"CMAKE_CURRENT_SOURCE_DIR",&local_29);
  psVar1 = cmState::GetSourceDirectory_abi_cxx11_(this->State);
  SetDefinition(this,&local_28,psVar1);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"CMAKE_BINARY_DIR",&local_29);
  psVar1 = cmState::GetBinaryDirectory_abi_cxx11_(this->State);
  SetDefinition(this,&local_28,psVar1);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"CMAKE_CURRENT_BINARY_DIR",&local_29);
  psVar1 = cmState::GetBinaryDirectory_abi_cxx11_(this->State);
  SetDefinition(this,&local_28,psVar1);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void cmStateSnapshot::SetDirectoryDefinitions()
{
  this->SetDefinition("CMAKE_SOURCE_DIR", this->State->GetSourceDirectory());
  this->SetDefinition("CMAKE_CURRENT_SOURCE_DIR",
                      this->State->GetSourceDirectory());
  this->SetDefinition("CMAKE_BINARY_DIR", this->State->GetBinaryDirectory());
  this->SetDefinition("CMAKE_CURRENT_BINARY_DIR",
                      this->State->GetBinaryDirectory());
}